

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

JointObservationHistoryTree * __thiscall
PlanningUnitMADPDiscrete::GetJointObservationHistoryTree(PlanningUnitMADPDiscrete *this,Index johI)

{
  const_reference ppJVar1;
  ostream *poVar2;
  uint in_ESI;
  vector<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_> *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  value_type local_8;
  
  if ((pointer)(ulong)in_ESI <
      in_RDI[4].
      super__Vector_base<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppJVar1 = std::
              vector<JointObservationHistoryTree_*,_std::allocator<JointObservationHistoryTree_*>_>
              ::at(in_RDI,in_stack_ffffffffffffffd8);
    local_8 = *ppJVar1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "PlanningUnitMADPDiscrete::GetJointObservationHistoryTree - Warning: ")
    ;
    poVar2 = std::operator<<(poVar2,"index (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
    poVar2 = std::operator<<(poVar2,")out of bound!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_8 = (value_type)0x0;
  }
  return local_8;
}

Assistant:

JointObservationHistoryTree* PlanningUnitMADPDiscrete::
    GetJointObservationHistoryTree(Index johI) const
{
    if(johI < _m_nrJointObservationHistories)
        return(_m_jointObservationHistoryTreeVector.at(johI));
    else
    {
    cerr << "PlanningUnitMADPDiscrete::GetJointObservationHistoryTree - Warning: "<<
        "index (" << johI <<")out of bound!" << endl;
    return(0);
    }
}